

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  double *pdVar8;
  byte *pbVar9;
  uint uVar10;
  byte *pbVar11;
  Ch c;
  int iVar12;
  ulong uVar13;
  uint i;
  ulong i_00;
  int iVar14;
  Ch c_8;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double local_68;
  
  pbVar9 = (byte *)is->current_;
  pbVar11 = pbVar9 + (is->count_ - (long)is->buffer_);
  bVar1 = *pbVar9;
  bVar6 = bVar1;
  if (bVar1 == 0x2d) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    pbVar9 = (byte *)is->current_;
    bVar6 = *pbVar9;
  }
  if (bVar6 == 0x30) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    uVar10 = (uint)(byte)*is->current_;
    local_68 = 0.0;
    bVar5 = false;
    i_00 = 0;
    iVar14 = 0;
    bVar4 = false;
    bVar3 = false;
    i = 0;
  }
  else {
    if (8 < (byte)(bVar6 - 0x31)) {
      pbVar9 = pbVar9 + (is->count_ - (long)is->buffer_);
      *(undefined4 *)(this + 0x30) = 3;
      goto LAB_0013f3f0;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    i = bVar6 - 0x30;
    bVar6 = *is->current_;
    uVar13 = (ulong)bVar6;
    uVar10 = (uint)bVar6;
    local_68 = 0.0;
    if (bVar1 == 0x2d) {
      if ((byte)(bVar6 - 0x30) < 10) {
        iVar14 = 0;
LAB_0013ede2:
        if (i < 0xccccccc) {
LAB_0013edea:
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          i = (i * 10 + (int)uVar13) - 0x30;
          iVar14 = iVar14 + 1;
          bVar6 = *is->current_;
          uVar13 = (ulong)bVar6;
          if (9 < (byte)(bVar6 - 0x30)) goto LAB_0013eed6;
          goto LAB_0013ede2;
        }
        if (i != 0xccccccc) goto LAB_0013ee6c;
        if ((byte)uVar13 < 0x39) goto LAB_0013edea;
        i = 0xccccccc;
        uVar13 = 0x39;
LAB_0013ee6c:
        i_00 = (ulong)i;
        if (bVar1 == 0x2d) {
          do {
            if ((0xccccccccccccccb < i_00) && (0x38 < (byte)uVar13 || i_00 != 0xccccccccccccccc))
            goto LAB_0013ef4b;
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
            i_00 = (uVar13 & 0xf) + i_00 * 10;
            iVar14 = iVar14 + 1;
            bVar6 = *is->current_;
            uVar13 = (ulong)bVar6;
          } while ((byte)(bVar6 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < i_00) && (0x35 < (byte)uVar13 || i_00 != 0x1999999999999999))
            goto LAB_0013ef4b;
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
            i_00 = (uVar13 & 0xf) + i_00 * 10;
            iVar14 = iVar14 + 1;
            bVar6 = *is->current_;
            uVar13 = (ulong)bVar6;
          } while ((byte)(bVar6 - 0x30) < 10);
        }
        uVar10 = (uint)bVar6;
        local_68 = 0.0;
        bVar3 = true;
        bVar5 = false;
        bVar4 = false;
      }
      else {
LAB_0013f445:
        bVar5 = false;
        i_00 = 0;
        iVar14 = 0;
        bVar4 = false;
        bVar3 = false;
      }
    }
    else {
      if (9 < (byte)(bVar6 - 0x30)) goto LAB_0013f445;
      iVar14 = 0;
      do {
        if (0x19999998 < i) {
          if (i != 0x19999999) goto LAB_0013ee6c;
          if (0x35 < (byte)uVar13) {
            i = 0x19999999;
            goto LAB_0013ee6c;
          }
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        i = (i * 10 + (int)uVar13) - 0x30;
        iVar14 = iVar14 + 1;
        bVar6 = *is->current_;
        uVar13 = (ulong)bVar6;
      } while ((byte)(bVar6 - 0x30) < 10);
LAB_0013eed6:
      uVar10 = (uint)bVar6;
      bVar5 = false;
      i_00 = 0;
      bVar4 = false;
      bVar3 = false;
      local_68 = 0.0;
    }
  }
  goto LAB_0013efbf;
LAB_0013ef4b:
  auVar15._8_4_ = (int)(i_00 >> 0x20);
  auVar15._0_8_ = i_00;
  auVar15._12_4_ = 0x45300000;
  local_68 = (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
  do {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    local_68 = (double)((int)uVar13 + -0x30) + local_68 * 10.0;
    bVar6 = *is->current_;
    uVar13 = (ulong)bVar6;
    uVar10 = (uint)bVar6;
  } while ((byte)(bVar6 - 0x30) < 10);
  bVar5 = true;
  bVar4 = true;
  bVar3 = true;
LAB_0013efbf:
  if ((char)uVar10 == '.') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    bVar6 = *is->current_;
    uVar10 = (uint)bVar6;
    if ((byte)(bVar6 - 0x3a) < 0xf6) {
      pbVar9 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_0013f3f0;
    }
    iVar7 = 0;
    if (!bVar5) {
      if (!bVar3) {
        i_00 = (ulong)i;
      }
      iVar7 = 0;
      do {
        if ((0x39 < (byte)uVar10) || (i_00 >> 0x35 != 0)) break;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        iVar7 = iVar7 + -1;
        i_00 = (ulong)(uVar10 - 0x30) + i_00 * 10;
        iVar14 = iVar14 + (uint)(i_00 != 0);
        uVar10 = (uint)(byte)*is->current_;
      } while ('/' < *is->current_);
      auVar16._8_4_ = (int)(i_00 >> 0x20);
      auVar16._0_8_ = i_00;
      auVar16._12_4_ = 0x45300000;
      local_68 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
      bVar4 = true;
    }
    bVar6 = (byte)uVar10;
    while ((byte)(bVar6 - 0x30) < 10) {
      if (iVar14 < 0x11) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        local_68 = (double)(int)(uVar10 - 0x30) + local_68 * 10.0;
        iVar7 = iVar7 + -1;
        if (0.0 < local_68) {
          iVar14 = iVar14 + 1;
        }
      }
      else {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      }
      bVar6 = *is->current_;
      uVar10 = (uint)bVar6;
    }
  }
  else {
    iVar7 = 0;
  }
  if ((uVar10 | 0x20) == 0x65) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    uVar13 = (ulong)i;
    if (bVar3) {
      uVar13 = i_00;
    }
    if (!bVar4) {
      auVar17._8_4_ = (int)(uVar13 >> 0x20);
      auVar17._0_8_ = uVar13;
      auVar17._12_4_ = 0x45300000;
      local_68 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      bVar4 = true;
    }
    bVar5 = false;
    if (*is->current_ == '+') {
LAB_0013f191:
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    }
    else if (*is->current_ == '-') {
      bVar5 = true;
      goto LAB_0013f191;
    }
    bVar6 = *is->current_;
    if (9 < (byte)(bVar6 - 0x30)) {
      pbVar9 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      *(undefined4 *)(this + 0x30) = 0xf;
LAB_0013f3f0:
      *(byte **)(this + 0x38) = pbVar9;
      return;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    iVar12 = bVar6 - 0x30;
    if (bVar5) {
      bVar2 = *is->current_;
      bVar6 = bVar2 - 0x30;
      do {
        if (9 < bVar6) goto LAB_0013f24d;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        iVar12 = iVar12 * 10 + (uint)bVar2 + -0x30;
        bVar2 = *is->current_;
        bVar6 = bVar2 - 0x30;
      } while (iVar12 <= (iVar7 + 0x7ffffff7) / 10);
      while (bVar6 < 10) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        bVar6 = *is->current_ - 0x30;
      }
LAB_0013f24d:
      iVar14 = -iVar12;
      if (!bVar5) {
        iVar14 = iVar12;
      }
      goto LAB_0013f259;
    }
    do {
      bVar6 = *is->current_;
      if (9 < (byte)(bVar6 - 0x30)) goto LAB_0013f24d;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      iVar12 = iVar12 * 10 + (uint)bVar6 + -0x30;
    } while (iVar12 <= 0x134 - iVar7);
  }
  else {
    iVar14 = 0;
LAB_0013f259:
    if (!bVar4) {
      if (bVar3) {
        if (bVar1 == 0x2d) {
          bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int64(handler,-i_00);
        }
        else {
          bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint64(handler,i_00);
        }
      }
      else if (bVar1 == 0x2d) {
        bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int(handler,-i);
      }
      else {
        bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint(handler,i);
      }
      if (bVar5 != false) {
        return;
      }
      *(undefined4 *)(this + 0x30) = 0x10;
      goto LAB_0013f35a;
    }
    uVar10 = iVar14 + iVar7;
    if ((int)uVar10 < -0x134) {
      dVar18 = 0.0;
      if (uVar10 < 0xfffffd98) goto LAB_0013f365;
      dVar18 = local_68 /
               (*(double *)(internal::Pow10(int)::e + (ulong)(-uVar10 - 0x134) * 8) * 1e+308);
    }
    else if ((int)uVar10 < 0) {
      dVar18 = local_68 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar10 * 8);
    }
    else {
      dVar18 = local_68 * *(double *)(internal::Pow10(int)::e + (ulong)uVar10 * 8);
    }
    if (dVar18 <= 1.79769313486232e+308) {
LAB_0013f365:
      if (bVar1 == 0x2d) {
        dVar18 = -dVar18;
      }
      pdVar8 = (double *)(handler->stack_).stackTop_;
      if ((long)(handler->stack_).stackEnd_ - (long)pdVar8 < 0x10) {
        internal::Stack<rapidjson::CrtAllocator>::
        Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                  (&handler->stack_,1);
        pdVar8 = (double *)(handler->stack_).stackTop_;
      }
      (handler->stack_).stackTop_ = (char *)(pdVar8 + 2);
      pdVar8[1] = 1.3140351748525322e-298;
      *pdVar8 = dVar18;
      return;
    }
  }
  *(undefined4 *)(this + 0x30) = 0xd;
LAB_0013f35a:
  *(byte **)(this + 0x38) = pbVar11;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }